

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdump::OnFunctionSymbol
          (BinaryReaderObjdump *this,Index index,uint32_t flags,string_view name,Index func_index)

{
  bool bVar1;
  Result RVar2;
  size_type sVar3;
  const_pointer pcVar4;
  string_view sVar5;
  BinaryReaderObjdump *local_48;
  char *local_40;
  Index func_index_local;
  uint32_t flags_local;
  Index index_local;
  BinaryReaderObjdump *this_local;
  string_view name_local;
  
  name_local.data_ = (char *)name.size_;
  this_local = (BinaryReaderObjdump *)name.data_;
  bVar1 = string_view::empty((string_view *)&this_local);
  if (bVar1) {
    sVar5 = BinaryReaderObjdumpBase::GetFunctionName
                      (&this->super_BinaryReaderObjdumpBase,func_index);
    local_48 = (BinaryReaderObjdump *)sVar5.data_;
    this_local = local_48;
    local_40 = (char *)sVar5.size_;
    name_local.data_ = local_40;
  }
  sVar3 = string_view::length((string_view *)&this_local);
  pcVar4 = string_view::data((string_view *)&this_local);
  PrintDetails(this,"   - %d: F <%.*s> func=%u",(ulong)index,sVar3 & 0xffffffff,pcVar4,
               (ulong)func_index);
  RVar2 = PrintSymbolFlags(this,flags);
  return (Result)RVar2.enum_;
}

Assistant:

Result BinaryReaderObjdump::OnFunctionSymbol(Index index,
                                             uint32_t flags,
                                             string_view name,
                                             Index func_index) {
  if (name.empty()) {
    name = GetFunctionName(func_index);
  }
  PrintDetails("   - %d: F <" PRIstringview "> func=%" PRIindex, index,
               WABT_PRINTF_STRING_VIEW_ARG(name), func_index);
  return PrintSymbolFlags(flags);
}